

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeExtract.cpp
# Opt level: O3

void __thiscall
cali::AttributeExtract::AttributeExtractImpl::process_node
          (AttributeExtractImpl *this,CaliperMetadataAccessInterface *db,Node *node)

{
  undefined8 uVar1;
  initializer_list<cali::Entry> __l;
  EntryList rec;
  allocator_type local_61;
  undefined1 local_60 [32];
  Entry local_40;
  
  if (*(long *)(node + 0x30) == 8) {
    local_40.m_node = (this->m_id_attr).m_node;
    if (local_40.m_node == (Node *)0x0) {
      local_60._0_8_ = (pointer)(local_60 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"attribute.id","");
      local_40.m_node = (Node *)(**(code **)(*(long *)db + 0x20))(db,local_60,3,1,0,0,0);
      (this->m_id_attr).m_node = local_40.m_node;
      if ((pointer)local_60._0_8_ != (pointer)(local_60 + 0x10)) {
        operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
        local_40.m_node = (this->m_id_attr).m_node;
      }
    }
    local_40.m_value.m_v.value = *(anon_union_8_7_33918203_for_value *)(node + 0x10);
    local_40.m_value.m_v.type_and_size = 3;
    __l._M_len = 1;
    __l._M_array = &local_40;
    std::vector<cali::Entry,_std::allocator<cali::Entry>_>::vector
              ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_60,__l,&local_61);
    do {
      if (*(long *)(node + 0x10) == -1) break;
      local_40.m_node = (Node *)(**(code **)(*(long *)db + 8))(db,*(long *)(node + 0x30));
      local_40.m_value.m_v.type_and_size = *(uint64_t *)(node + 0x38);
      local_40.m_value.m_v.value = *(anon_union_8_7_33918203_for_value *)(node + 0x40);
      if (local_60._8_8_ == local_60._16_8_) {
        std::vector<cali::Entry,_std::allocator<cali::Entry>_>::_M_realloc_insert<cali::Entry>
                  ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_60,
                   (iterator)local_60._8_8_,&local_40);
      }
      else {
        (((Variant *)(local_60._8_8_ + 8))->m_v).value = local_40.m_value.m_v.value;
        *(Node **)local_60._8_8_ = local_40.m_node;
        (((Variant *)(local_60._8_8_ + 8))->m_v).type_and_size = local_40.m_value.m_v.type_and_size;
        local_60._8_8_ = local_60._8_8_ + 0x18;
      }
      node = *(Node **)(*(long *)node + *(long *)(node + 8));
    } while (node != (Node *)0x0);
    if ((this->m_snap_fn).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar1 = std::__throw_bad_function_call();
      if ((pointer)local_60._0_8_ != (pointer)local_60) {
        operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
      }
      _Unwind_Resume(uVar1);
    }
    (*(this->m_snap_fn)._M_invoker)
              ((_Any_data *)this,db,(vector<cali::Entry,_std::allocator<cali::Entry>_> *)local_60);
    if ((pointer)local_60._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ - local_60._0_8_);
    }
  }
  return;
}

Assistant:

void process_node(CaliperMetadataAccessInterface& db, const Node* node)
    {
        if (node->attribute() != s_attr_id)
            return;

        if (!m_id_attr)
            m_id_attr = db.create_attribute("attribute.id", CALI_TYPE_UINT, CALI_ATTR_ASVALUE);

        EntryList rec { Entry(m_id_attr, node->id()) };

        for (; node && node->id() != CALI_INV_ID; node = node->parent())
            rec.push_back(Entry(db.get_attribute(node->attribute()), node->data()));

        m_snap_fn(db, rec);
    }